

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleShapeEx.cpp
# Opt level: O3

int __thiscall
cbtPrimitiveTriangle::clip_triangle
          (cbtPrimitiveTriangle *this,cbtPrimitiveTriangle *other,cbtVector3 *clipped_points)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  cbtVector3 *e1;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  cbtVector3 temp_points1 [16];
  cbtVector3 temp_points [16];
  cbtVector4 local_228;
  cbtVector3 local_218 [16];
  cbtVector3 local_118 [16];
  
  fVar1 = this->m_vertices[1].m_floats[0];
  uVar3 = *(ulong *)(this->m_vertices[1].m_floats + 1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(this->m_vertices[0].m_floats + 1);
  fVar2 = (this->m_plane).super_cbtVector3.m_floats[0];
  uVar4 = *(ulong *)((this->m_plane).super_cbtVector3.m_floats + 1);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar4;
  auVar13 = vsubps_avx(auVar10,auVar12);
  auVar12 = ZEXT416((uint)(fVar1 - this->m_vertices[0].m_floats[0]));
  auVar9 = vpermt2ps_avx512vl(auVar13,_DAT_009d86b0,auVar12);
  auVar25._0_4_ = (float)uVar4 * auVar9._0_4_;
  auVar25._4_4_ = (float)(uVar4 >> 0x20) * auVar9._4_4_;
  auVar25._8_4_ = auVar9._8_4_ * 0.0;
  auVar25._12_4_ = auVar9._12_4_ * 0.0;
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * auVar13._0_4_)),auVar12,auVar22);
  auVar9 = vpermt2ps_avx512vl(auVar22,_DAT_009d86b0,ZEXT416((uint)fVar2));
  auVar9 = vfmsub213ps_fma(auVar9,auVar13,auVar25);
  fVar2 = auVar9._0_4_;
  auVar13._0_4_ = fVar2 * fVar2;
  fVar5 = auVar9._4_4_;
  auVar13._4_4_ = fVar5 * fVar5;
  fVar6 = auVar9._8_4_;
  auVar13._8_4_ = fVar6 * fVar6;
  fVar7 = auVar9._12_4_;
  auVar13._12_4_ = fVar7 * fVar7;
  auVar13 = vmovshdup_avx(auVar13);
  auVar13 = vfmadd231ss_fma(auVar13,auVar9,auVar9);
  auVar13 = vfmadd231ss_fma(auVar13,auVar12,auVar12);
  auVar13 = vsqrtss_avx(auVar13,auVar13);
  fVar11 = 1.0 / auVar13._0_4_;
  local_228.super_cbtVector3.m_floats[2] = auVar12._0_4_ * fVar11;
  auVar9._0_4_ = fVar2 * fVar11;
  auVar9._4_4_ = fVar5 * fVar11;
  auVar9._8_4_ = fVar6 * fVar11;
  auVar9._12_4_ = fVar7 * fVar11;
  auVar13 = vmovshdup_avx(auVar9);
  local_228.super_cbtVector3.m_floats._0_8_ = vmovlps_avx(auVar9);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar3 * auVar13._0_4_)),auVar9,ZEXT416((uint)fVar1)
                          );
  auVar13 = vmovshdup_avx(auVar10);
  auVar13 = vfmadd213ss_fma(auVar13,ZEXT416((uint)local_228.super_cbtVector3.m_floats[2]),auVar9);
  local_228.super_cbtVector3.m_floats[3] = auVar13._0_4_;
  iVar8 = bt_plane_clip_triangle
                    (&local_228,other->m_vertices,other->m_vertices + 1,other->m_vertices + 2,
                     local_118);
  if (iVar8 != 0) {
    fVar1 = this->m_vertices[2].m_floats[0];
    uVar3 = *(ulong *)(this->m_vertices[2].m_floats + 1);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar3;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(this->m_vertices[1].m_floats + 1);
    fVar2 = (this->m_plane).super_cbtVector3.m_floats[0];
    uVar4 = *(ulong *)((this->m_plane).super_cbtVector3.m_floats + 1);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar4;
    auVar13 = vsubps_avx(auVar17,auVar19);
    auVar12 = ZEXT416((uint)(fVar1 - this->m_vertices[1].m_floats[0]));
    auVar9 = vpermt2ps_avx512vl(auVar13,_DAT_009d86b0,auVar12);
    auVar26._0_4_ = (float)uVar4 * auVar9._0_4_;
    auVar26._4_4_ = (float)(uVar4 >> 0x20) * auVar9._4_4_;
    auVar26._8_4_ = auVar9._8_4_ * 0.0;
    auVar26._12_4_ = auVar9._12_4_ * 0.0;
    auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * auVar13._0_4_)),auVar12,auVar23);
    auVar9 = vpermt2ps_avx512vl(auVar23,_DAT_009d86b0,ZEXT416((uint)fVar2));
    auVar9 = vfmsub213ps_fma(auVar9,auVar13,auVar26);
    fVar2 = auVar9._0_4_;
    auVar14._0_4_ = fVar2 * fVar2;
    fVar5 = auVar9._4_4_;
    auVar14._4_4_ = fVar5 * fVar5;
    fVar6 = auVar9._8_4_;
    auVar14._8_4_ = fVar6 * fVar6;
    fVar7 = auVar9._12_4_;
    auVar14._12_4_ = fVar7 * fVar7;
    auVar13 = vmovshdup_avx(auVar14);
    auVar13 = vfmadd231ss_fma(auVar13,auVar9,auVar9);
    auVar13 = vfmadd231ss_fma(auVar13,auVar12,auVar12);
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    fVar11 = 1.0 / auVar13._0_4_;
    local_228.super_cbtVector3.m_floats[2] = auVar12._0_4_ * fVar11;
    auVar16._0_4_ = fVar2 * fVar11;
    auVar16._4_4_ = fVar5 * fVar11;
    auVar16._8_4_ = fVar6 * fVar11;
    auVar16._12_4_ = fVar7 * fVar11;
    auVar13 = vmovshdup_avx(auVar16);
    local_228.super_cbtVector3.m_floats._0_8_ = vmovlps_avx(auVar16);
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar3 * auVar13._0_4_)),auVar16,
                             ZEXT416((uint)fVar1));
    auVar13 = vmovshdup_avx(auVar17);
    auVar13 = vfmadd213ss_fma(auVar13,ZEXT416((uint)local_228.super_cbtVector3.m_floats[2]),auVar9);
    local_228.super_cbtVector3.m_floats[3] = auVar13._0_4_;
    iVar8 = bt_plane_clip_polygon(&local_228,local_118,iVar8,local_218);
    if (iVar8 != 0) {
      fVar1 = this->m_vertices[0].m_floats[0];
      uVar3 = *(ulong *)(this->m_vertices[0].m_floats + 1);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar3;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(this->m_vertices[2].m_floats + 1);
      fVar2 = (this->m_plane).super_cbtVector3.m_floats[0];
      uVar4 = *(ulong *)((this->m_plane).super_cbtVector3.m_floats + 1);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar4;
      auVar13 = vsubps_avx(auVar18,auVar20);
      auVar12 = ZEXT416((uint)(fVar1 - this->m_vertices[2].m_floats[0]));
      auVar9 = vpermt2ps_avx512vl(auVar13,_DAT_009d86b0,auVar12);
      auVar10 = vpermi2ps_avx512vl(_DAT_009d86b0,auVar24,ZEXT416((uint)fVar2));
      auVar27._0_4_ = (float)uVar4 * auVar9._0_4_;
      auVar27._4_4_ = (float)(uVar4 >> 0x20) * auVar9._4_4_;
      auVar27._8_4_ = auVar9._8_4_ * 0.0;
      auVar27._12_4_ = auVar9._12_4_ * 0.0;
      auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * auVar13._0_4_)),auVar12,auVar24);
      auVar9 = vfmsub213ps_fma(auVar10,auVar13,auVar27);
      fVar2 = auVar9._0_4_;
      auVar15._0_4_ = fVar2 * fVar2;
      fVar5 = auVar9._4_4_;
      auVar15._4_4_ = fVar5 * fVar5;
      fVar6 = auVar9._8_4_;
      auVar15._8_4_ = fVar6 * fVar6;
      fVar7 = auVar9._12_4_;
      auVar15._12_4_ = fVar7 * fVar7;
      auVar13 = vmovshdup_avx(auVar15);
      auVar13 = vfmadd231ss_fma(auVar13,auVar9,auVar9);
      auVar13 = vfmadd231ss_fma(auVar13,auVar12,auVar12);
      auVar13 = vsqrtss_avx(auVar13,auVar13);
      fVar11 = 1.0 / auVar13._0_4_;
      local_228.super_cbtVector3.m_floats[2] = auVar12._0_4_ * fVar11;
      auVar21._0_4_ = fVar2 * fVar11;
      auVar21._4_4_ = fVar5 * fVar11;
      auVar21._8_4_ = fVar6 * fVar11;
      auVar21._12_4_ = fVar7 * fVar11;
      auVar13 = vmovshdup_avx(auVar21);
      local_228.super_cbtVector3.m_floats._0_8_ = vmovlps_avx(auVar21);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar3 * auVar13._0_4_)),auVar21,
                               ZEXT416((uint)fVar1));
      auVar13 = vmovshdup_avx(auVar18);
      auVar13 = vfmadd213ss_fma(auVar13,ZEXT416((uint)local_228.super_cbtVector3.m_floats[2]),auVar9
                               );
      local_228.super_cbtVector3.m_floats[3] = auVar13._0_4_;
      iVar8 = bt_plane_clip_polygon(&local_228,local_218,iVar8,clipped_points);
      return iVar8;
    }
  }
  return 0;
}

Assistant:

int cbtPrimitiveTriangle::clip_triangle(cbtPrimitiveTriangle& other, cbtVector3* clipped_points)
{
	// edge 0

	cbtVector3 temp_points[MAX_TRI_CLIPPING];

	cbtVector4 edgeplane;

	get_edge_plane(0, edgeplane);

	int clipped_count = bt_plane_clip_triangle(
		edgeplane, other.m_vertices[0], other.m_vertices[1], other.m_vertices[2], temp_points);

	if (clipped_count == 0) return 0;

	cbtVector3 temp_points1[MAX_TRI_CLIPPING];

	// edge 1
	get_edge_plane(1, edgeplane);

	clipped_count = bt_plane_clip_polygon(edgeplane, temp_points, clipped_count, temp_points1);

	if (clipped_count == 0) return 0;

	// edge 2
	get_edge_plane(2, edgeplane);

	clipped_count = bt_plane_clip_polygon(
		edgeplane, temp_points1, clipped_count, clipped_points);

	return clipped_count;
}